

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::ProjectionLight::PDF_Le(ProjectionLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  bool bVar1;
  Float FVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3<float> VVar10;
  Point3<float> PVar11;
  Tuple3<pbrt::Point3,_float> local_38;
  undefined1 local_28 [16];
  
  auVar6 = in_ZMM0._8_56_;
  *pdfPos = 0.0;
  VVar10 = Transform::ApplyInverse<float>(&(this->super_LightBase).renderFromLight,&ray->d);
  local_38.z = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  local_38._0_8_ = vmovlps_avx(auVar3._0_16_);
  VVar10 = Normalize<float>((Vector3<float> *)&local_38);
  fVar7 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  if (this->hither <= fVar7) {
    local_38._0_8_ = vmovlps_avx(auVar4._0_16_);
    local_38.z = fVar7;
    PVar11 = Transform::operator()(&this->screenFromLight,(Point3<float> *)&local_38);
    auVar5._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    local_28 = auVar5._0_16_;
    local_38._0_8_ = vmovlps_avx(local_28);
    bVar1 = Inside<float>((Point2<float> *)&local_38,&this->screenBounds);
    if (bVar1) {
      local_38._0_8_ = vmovlps_avx(local_28);
      FVar2 = PiecewiseConstant2D::PDF(&this->distrib,(Point2f *)&local_38);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>;
      auVar9 = vsubps_avx(auVar9,auVar8);
      auVar8 = vmovshdup_avx(auVar9);
      *pdfDir = (FVar2 * auVar9._0_4_ * auVar8._0_4_) / (fVar7 * fVar7 * fVar7 * this->A);
      return;
    }
  }
  *pdfDir = 0.0;
  return;
}

Assistant:

void ProjectionLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0;
    // Transform ray direction to light space and reject invalid ones
    Vector3f w = Normalize(renderFromLight.ApplyInverse(ray.d));
    if (w.z < hither) {
        *pdfDir = 0;
        return;
    }

    // Compute screen space coordinates for direction and test against bounds
    Point3f ps = screenFromLight(Point3f(w));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds)) {
        *pdfDir = 0;
        return;
    }

    *pdfDir = distrib.PDF(Point2f(ps.x, ps.y)) * screenBounds.Area() /
              (A * Pow<3>(CosTheta(w)));
}